

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O1

int __thiscall mpt::layout::line::convert(line *this,type_t type,void *ptr)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  iVar6 = type_properties<mpt::layout::line_*>::id(true);
  iVar8 = (int)type;
  if (iVar6 < 0) {
    iVar6 = 0x100;
  }
  else if ((0 < iVar8) && (iVar7 = type_properties<mpt::layout::line_*>::id(true), iVar7 == iVar8))
  {
    if (ptr == (void *)0x0) {
      return iVar6;
    }
    *(line **)ptr = this;
    return iVar6;
  }
  if (type == 0) {
    if (ptr == (void *)0x0) {
      return iVar6;
    }
    *(uint8_t **)ptr = convert::fmt;
    return iVar6;
  }
  if (ptr != (void *)0x0 && iVar8 == 0x100) {
    *(line **)ptr = this;
  }
  if (iVar8 != 0x100) {
    if (iVar8 == 0x84 && ptr != (void *)0x0) {
      *(object **)ptr = &this->super_object;
    }
    if (iVar8 != 0x84) {
      if (0 < iVar8) {
        uVar5 = *(undefined8 *)&this->super_line;
        fVar1 = (this->super_line).from.super_point<float>.x;
        fVar2 = (this->super_line).from.super_point<float>.y;
        fVar3 = (this->super_line).to.super_point<float>.x;
        fVar4 = (this->super_line).to.super_point<float>.y;
        iVar7 = type_properties<mpt::line>::id(true);
        if (iVar7 == iVar8) {
          if (ptr == (void *)0x0) {
            return 0x84;
          }
          *(undefined8 *)ptr = uVar5;
          *(float *)((long)ptr + 8) = fVar1;
          *(float *)((long)ptr + 0xc) = fVar2;
          *(float *)((long)ptr + 0x10) = fVar3;
          *(float *)((long)ptr + 0x14) = fVar4;
          return 0x84;
        }
        if ((0 < iVar8) && (iVar7 = type_properties<mpt::color_*>::id(true), iVar7 == iVar8)) {
          if (ptr != (void *)0x0) {
            *(line **)ptr = &this->super_line;
          }
          iVar8 = type_properties<mpt::lineattr>::id(true);
          goto LAB_00137ec1;
        }
      }
      if (iVar8 < 1) {
        return -3;
      }
      iVar7 = type_properties<mpt::lineattr_*>::id(true);
      if (iVar7 != iVar8) {
        return -3;
      }
      if (ptr != (void *)0x0) {
        *(lineattr **)ptr = &(this->super_line).attr;
      }
      iVar8 = type_properties<mpt::color>::id(true);
      goto LAB_00137ec1;
    }
  }
  iVar8 = type_properties<mpt::line>::id(true);
LAB_00137ec1:
  if (0 < iVar8) {
    iVar6 = iVar8;
  }
  return iVar6;
}

Assistant:

int layout::line::convert(type_t type, void *ptr)
{
	int me = type_properties<line *>::id(true);
	if (me < 0) {
		me = TypeMetaPtr;
	}
	else if (assign(this, type, ptr)) {
		return me;
	}
	
	if (!type) {
		static const uint8_t fmt[] = {
			TypeObjectPtr,
			0
		};
		if (ptr) *static_cast<const uint8_t **>(ptr) = fmt;
		return me;
	}
	
	if (assign(static_cast<metatype *>(this), type, ptr)) {
		int li = type_properties<::mpt::line>::id(true);
		return li > 0 ? li : me;
	}
	if (assign(static_cast<object *>(this), type, ptr)) {
		int li = type_properties<::mpt::line>::id(true);
		return li > 0 ? li : me;
	}
	if (assign(static_cast< ::mpt::line>(*this), type, ptr)) {
		return TypeObjectPtr;
	}
	if (assign(&color, type, ptr)) {
		int la = type_properties<::mpt::lineattr>::id(true);
		return la > 0 ? la : me;
	}
	if (assign(&attr, type, ptr)) {
		int col = type_properties<::mpt::color>::id(true);
		return col > 0 ? col : me;
	}
	return BadType;
}